

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ftglyph.c
# Opt level: O1

FT_Error FT_New_Glyph(FT_Library library,FT_Glyph_Format format,FT_Glyph *aglyph)

{
  FT_Error FVar1;
  FT_Renderer_conflict pFVar2;
  FT_Glyph_Class *clazz;
  
  FVar1 = 6;
  if (aglyph != (FT_Glyph *)0x0 && library != (FT_Library)0x0) {
    if (format == FT_GLYPH_FORMAT_SVG) {
      clazz = &ft_svg_glyph_class;
    }
    else if (format == FT_GLYPH_FORMAT_BITMAP) {
      clazz = &ft_bitmap_glyph_class;
    }
    else if (format == FT_GLYPH_FORMAT_OUTLINE) {
      clazz = &ft_outline_glyph_class;
    }
    else {
      pFVar2 = FT_Lookup_Renderer(library,format,(FT_ListNode *)0x0);
      clazz = &pFVar2->glyph_class;
      if (pFVar2 == (FT_Renderer_conflict)0x0) {
        clazz = (FT_Glyph_Class *)0x0;
      }
    }
    if (clazz != (FT_Glyph_Class *)0x0) {
      FVar1 = ft_new_glyph(library,clazz,aglyph);
      return FVar1;
    }
    FVar1 = 0x12;
  }
  return FVar1;
}

Assistant:

FT_EXPORT( FT_Error )
  FT_New_Glyph( FT_Library       library,
                FT_Glyph_Format  format,
                FT_Glyph        *aglyph )
  {
    const FT_Glyph_Class*  clazz = NULL;

    if ( !library || !aglyph )
      return FT_THROW( Invalid_Argument );

    /* if it is a bitmap, that's easy :-) */
    if ( format == FT_GLYPH_FORMAT_BITMAP )
      clazz = &ft_bitmap_glyph_class;

    /* if it is an outline */
    else if ( format == FT_GLYPH_FORMAT_OUTLINE )
      clazz = &ft_outline_glyph_class;

#ifdef FT_CONFIG_OPTION_SVG
    /* if it is an SVG glyph */
    else if ( format == FT_GLYPH_FORMAT_SVG )
      clazz = &ft_svg_glyph_class;
#endif

    else
    {
      /* try to find a renderer that supports the glyph image format */
      FT_Renderer  render = FT_Lookup_Renderer( library, format, 0 );


      if ( render )
        clazz = &render->glyph_class;
    }

    if ( !clazz )
      return FT_THROW( Invalid_Glyph_Format );

    /* create FT_Glyph object */
    return ft_new_glyph( library, clazz, aglyph );
  }